

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_3::traverseProgramVariablePath
               (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *typePath,Program *program,string *path,VariableSearchFilter *filter)

{
  Shader *pSVar1;
  pointer pVVar2;
  size_t sVar3;
  size_t __n;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar7;
  long lVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar9;
  char *nameWithPath;
  long lVar10;
  VarType *pVVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  string blockMemeberName;
  string blockMemeberName_1;
  string blockName;
  bool local_fa;
  bool local_f9;
  string local_e0;
  VariableSearchFilter *local_c0;
  long local_b8;
  long local_b0;
  VarType *local_a8;
  long local_a0;
  Data local_98;
  Data local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  Program *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  Data local_40;
  undefined4 local_38;
  
  pvVar7 = ProgramInterfaceDefinition::Program::getShaders(program);
  iVar6 = (int)((ulong)((long)(pvVar7->
                              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar7->
                             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_f9 = 0 < iVar6;
  if (iVar6 < 1) {
    return local_f9;
  }
  local_b0 = 0;
  local_c0 = filter;
  local_50 = program;
LAB_00675c2b:
  pvVar7 = ProgramInterfaceDefinition::Program::getShaders(program);
  pSVar1 = (pvVar7->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
           )._M_impl.super__Vector_impl_data._M_start[local_b0];
  if ((filter->m_shaderTypeBits >> (pSVar1->m_shaderType & 0x1f) & 1) != 0) {
    pVVar2 = (typePath->
             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((typePath->
        super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
        )._M_impl.super__Vector_impl_data._M_finish != pVVar2) {
      (typePath->
      super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
      )._M_impl.super__Vector_impl_data._M_finish = pVVar2;
    }
    pcVar9 = *(char **)&(pSVar1->m_defaultBlock).variables.
                        super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ._M_impl;
    if (0 < (int)((ulong)((long)*(pointer *)
                                 ((long)&(pSVar1->m_defaultBlock).variables.
                                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                 + 8) - (long)pcVar9) >> 5) * -0x55555555) {
      bVar16 = true;
      lVar10 = 0;
      lVar14 = 0;
      do {
        if (((filter->m_storageBits >> (*(uint *)(pcVar9 + lVar10 + 0x18) & 0x1f) & 1) != 0) &&
           (bVar5 = traverseVariablePath(typePath,path,(VariableDeclaration *)(pcVar9 + lVar10)),
           bVar5)) {
          pcVar9 = extraout_RDX;
          if (bVar16) {
            return local_f9;
          }
          break;
        }
        lVar14 = lVar14 + 1;
        pcVar9 = *(char **)&(pSVar1->m_defaultBlock).variables.
                            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                            ._M_impl;
        lVar8 = (long)((int)((ulong)((long)*(pointer *)
                                            ((long)&(pSVar1->m_defaultBlock).variables.
                                                                                                        
                                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                            + 8) - (long)pcVar9) >> 5) * -0x55555555);
        lVar10 = lVar10 + 0x60;
        bVar16 = lVar14 < lVar8;
      } while (lVar14 < lVar8);
    }
    glu::parseVariableName_abi_cxx11_(&local_70,(glu *)(path->_M_dataplus)._M_p,pcVar9);
    lVar10 = *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                       super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                       ._M_impl.super__Vector_impl_data;
    if ((int)((ulong)((long)*(pointer *)
                             ((long)&(pSVar1->m_defaultBlock).interfaceBlocks.
                                     super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                             + 8) - lVar10) >> 4) * 0x38e38e39 < 1) {
      local_fa = true;
    }
    else {
      local_fa = true;
      pVVar11 = (VarType *)0x0;
      do {
        lVar14 = (long)pVVar11 * 0x90;
        if ((filter->m_storageBits >> (*(uint *)(lVar10 + 0x14 + lVar14) & 0x1f) & 1) != 0) {
          lVar10 = lVar10 + lVar14;
          pcVar9 = *(char **)(lVar10 + 0x28);
          if ((pcVar9 == (char *)local_70._M_string_length) &&
             ((pcVar9 == (char *)0x0 ||
              (iVar6 = bcmp(*(void **)(lVar10 + 0x20),local_70._M_dataplus._M_p,(size_t)pcVar9),
              pcVar9 = extraout_RDX_00, iVar6 == 0)))) {
            std::__cxx11::string::substr((ulong)&local_e0,(ulong)path);
            glu::parseVariableName_abi_cxx11_
                      ((string *)&local_90,(glu *)local_e0._M_dataplus._M_p,nameWithPath);
            lVar10 = *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                               super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                               ._M_impl.super__Vector_impl_data;
            lVar8 = *(long *)(lVar10 + 0x60 + lVar14);
            uVar12 = (int)(*(long *)(lVar10 + 0x68 + lVar14) - lVar8 >> 5) * -0x55555555;
            bVar16 = 0 < (int)uVar12;
            if ((int)uVar12 < 1) goto LAB_00676098;
            local_a8 = (VarType *)(lVar10 + lVar14);
            local_98.type = local_90.type;
            sVar3 = CONCAT44(uStack_84,local_88);
            lVar10 = -(ulong)(uVar12 & 0x7fffffff);
            bVar16 = true;
            uVar13 = 1;
            lVar15 = 0;
            local_b8 = lVar14;
            local_a0 = lVar10;
            goto LAB_00675fd7;
          }
          if (*(long *)(lVar10 + 0x48) == 0) {
            local_a8 = pVVar11;
            glu::parseVariableName_abi_cxx11_(&local_e0,(glu *)(path->_M_dataplus)._M_p,pcVar9);
            sVar4 = local_e0._M_string_length;
            lVar10 = *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                               super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                               ._M_impl.super__Vector_impl_data;
            lVar8 = *(long *)(lVar10 + 0x60 + lVar14);
            uVar12 = (int)(*(long *)(lVar10 + 0x68 + lVar14) - lVar8 >> 5) * -0x55555555;
            iVar6 = 0;
            bVar16 = 0 < (int)uVar12;
            if (0 < (int)uVar12) {
              local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(lVar10 + lVar14);
              local_98.type = (VarType *)local_e0._M_dataplus._M_p;
              lVar10 = -(ulong)(uVar12 & 0x7fffffff);
              bVar16 = true;
              uVar13 = 1;
              lVar15 = 0;
              local_b8 = lVar14;
              local_a0 = lVar10;
              do {
                sVar3 = *(size_t *)(lVar8 + 0x48 + lVar15);
                if ((sVar3 == sVar4) &&
                   ((sVar3 == 0 ||
                    (iVar6 = bcmp(*(void **)(lVar8 + 0x40 + lVar15),local_98.type,sVar3),
                    lVar10 = local_a0, iVar6 == 0)))) {
                  local_88 = 1;
                  local_90.type = (VarType *)local_48;
                  std::
                  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                  ::
                  emplace_back<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>
                            (typePath,(VariablePathComponent *)&local_90);
                  local_fa = traverseVariablePath
                                       (typePath,path,
                                        (VariableDeclaration *)
                                        (lVar15 + *(long *)(*(long *)&(pSVar1->m_defaultBlock).
                                                                      interfaceBlocks.
                                                                                                                                            
                                                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                                  ._M_impl.super__Vector_impl_data + 0x60 + local_b8
                                                  )));
                  iVar6 = 1;
                  filter = local_c0;
                  goto LAB_00675ed4;
                }
                bVar16 = uVar13 < (uVar12 & 0x7fffffff);
                lVar15 = lVar15 + 0x60;
                lVar14 = lVar10 + uVar13;
                uVar13 = uVar13 + 1;
              } while (lVar14 != 0);
              iVar6 = 0;
              filter = local_c0;
            }
LAB_00675ed4:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            pVVar11 = local_a8;
            if (bVar16) goto LAB_006760e8;
          }
        }
        pVVar11 = (VarType *)((long)&pVVar11->m_type + 1);
        lVar10 = *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                           super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                           ._M_impl.super__Vector_impl_data;
      } while ((long)pVVar11 <
               (long)((int)((ulong)((long)*(pointer *)
                                           ((long)&(pSVar1->m_defaultBlock).interfaceBlocks.
                                                                                                      
                                                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                           + 8) - lVar10) >> 4) * 0x38e38e39));
    }
    iVar6 = 5;
    goto LAB_006760e8;
  }
  goto LAB_00676127;
  while( true ) {
    bVar16 = uVar13 < (uVar12 & 0x7fffffff);
    lVar15 = lVar15 + 0x60;
    lVar14 = lVar10 + uVar13;
    uVar13 = uVar13 + 1;
    if (lVar14 == 0) break;
LAB_00675fd7:
    __n = *(size_t *)(lVar8 + 0x48 + lVar15);
    if ((__n == sVar3) &&
       ((__n == 0 ||
        (iVar6 = bcmp(*(void **)(lVar8 + 0x40 + lVar15),local_98.type,__n), lVar10 = local_a0,
        iVar6 == 0)))) {
      local_38 = 1;
      local_40.type = local_a8;
      std::
      vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
      ::emplace_back<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>
                (typePath,(VariablePathComponent *)&local_40);
      local_fa = traverseVariablePath
                           (typePath,&local_e0,
                            (VariableDeclaration *)
                            (lVar15 + *(long *)(*(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                                                                                                                    
                                                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                                  ._M_impl.super__Vector_impl_data + 0x60 + local_b8
                                               )));
      break;
    }
  }
LAB_00676098:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.type != &local_80) {
    operator_delete(local_90.type,local_80._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_fa = (bool)(local_fa & bVar16);
  iVar6 = 1;
  filter = local_c0;
LAB_006760e8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  program = local_50;
  if (((local_fa != false) && (iVar6 != 0)) && (iVar6 != 5)) {
    return local_f9;
  }
LAB_00676127:
  lVar14 = local_b0 + 1;
  pvVar7 = ProgramInterfaceDefinition::Program::getShaders(program);
  lVar10 = (long)(int)((ulong)((long)(pvVar7->
                                     super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar7->
                                    super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_f9 = lVar14 < lVar10;
  local_b0 = lVar14;
  if (lVar10 <= lVar14) {
    return local_f9;
  }
  goto LAB_00675c2b;
}

Assistant:

static bool traverseProgramVariablePath (std::vector<VariablePathComponent>& typePath, const ProgramInterfaceDefinition::Program* program, const std::string& path, const VariableSearchFilter& filter)
{
	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
	{
		const ProgramInterfaceDefinition::Shader* shader = program->getShaders()[shaderNdx];

		if (filter.matchesFilter(shader))
		{
			// \note modifying output variable even when returning false
			typePath.clear();
			if (traverseShaderVariablePath(typePath, shader, path, filter))
				return true;
		}
	}

	return false;
}